

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O0

CONCRETE_IO_HANDLE saslclientio_create(void *io_create_parameters)

{
  LOGGER_LOG p_Var1;
  FRAME_CODEC_HANDLE pFVar2;
  SASL_FRAME_CODEC_HANDLE pSVar3;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  SASL_CLIENT_IO_INSTANCE *result;
  SASLCLIENTIO_CONFIG *sasl_client_io_config;
  void *io_create_parameters_local;
  
  if (io_create_parameters == (void *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                ,"saslclientio_create",0x3c8,1,"NULL io_create_parameters");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if ((*io_create_parameters == 0) || (*(long *)((long)io_create_parameters + 8) == 0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                ,"saslclientio_create",0x3d0,1,
                "Bad parameters: underlying_io = %p, sasl_mechanism = %p",*io_create_parameters,
                *(undefined8 *)((long)io_create_parameters + 8));
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)calloc(1,0x80);
    if (l == (LOGGER_LOG)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                  ,"saslclientio_create",0x3d9,1,"Cannot allocate sasl client IO instance");
      }
    }
    else {
      *(undefined8 *)l = *io_create_parameters;
      pFVar2 = frame_codec_create(on_frame_codec_error,l);
      *(FRAME_CODEC_HANDLE *)(l + 0x60) = pFVar2;
      if (*(long *)(l + 0x60) == 0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                    ,"saslclientio_create",0x3e3,1,"frame_codec_create failed");
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        pSVar3 = sasl_frame_codec_create
                           (*(FRAME_CODEC_HANDLE *)(l + 0x60),on_sasl_frame_received_callback,
                            on_sasl_frame_codec_error,l);
        *(SASL_FRAME_CODEC_HANDLE *)(l + 0x58) = pSVar3;
        if (*(long *)(l + 0x58) == 0) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                      ,"saslclientio_create",0x3ee,1,"sasl_frame_codec_create failed");
          }
          frame_codec_destroy(*(FRAME_CODEC_HANDLE *)(l + 0x60));
          free(l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          *(undefined8 *)(l + 8) = 0;
          *(undefined8 *)(l + 0x10) = 0;
          *(undefined8 *)(l + 0x20) = 0;
          *(undefined8 *)(l + 0x18) = 0;
          *(undefined8 *)(l + 0x28) = 0;
          *(undefined8 *)(l + 0x30) = 0;
          *(undefined8 *)(l + 0x38) = 0;
          *(undefined8 *)(l + 0x40) = 0;
          *(undefined8 *)(l + 0x70) = *(undefined8 *)((long)io_create_parameters + 8);
          *(undefined4 *)(l + 0x68) = 0;
        }
      }
    }
  }
  return l;
}

Assistant:

CONCRETE_IO_HANDLE saslclientio_create(void* io_create_parameters)
{
    SASLCLIENTIO_CONFIG* sasl_client_io_config = (SASLCLIENTIO_CONFIG*)io_create_parameters;
    SASL_CLIENT_IO_INSTANCE* result;

    /* Codes_SRS_SASLCLIENTIO_01_005: [If `io_create_parameters` is NULL, `saslclientio_create` shall fail and return NULL.] */
    if (sasl_client_io_config == NULL)
    {
        LogError("NULL io_create_parameters");
        result = NULL;
    }
    /* Codes_SRS_SASLCLIENTIO_01_092: [If any of the `sasl_mechanism` or `underlying_io` members of the configuration structure are NULL, `saslclientio_create` shall fail and return NULL.] */
    else if ((sasl_client_io_config->underlying_io == NULL) ||
        (sasl_client_io_config->sasl_mechanism == NULL))
    {
        LogError("Bad parameters: underlying_io = %p, sasl_mechanism = %p",
            sasl_client_io_config->underlying_io, sasl_client_io_config->sasl_mechanism);
        result = NULL;
    }
    else
    {
        result = (SASL_CLIENT_IO_INSTANCE*)calloc(1, sizeof(SASL_CLIENT_IO_INSTANCE));
        if (result == NULL)
        {
            /* Codes_SRS_SASLCLIENTIO_01_006: [If memory cannot be allocated for the new instance, `saslclientio_create` shall fail and return NULL.] */
            LogError("Cannot allocate sasl client IO instance");
        }
        else
        {
            result->underlying_io = sasl_client_io_config->underlying_io;
            /* Codes_SRS_SASLCLIENTIO_01_089: [`saslclientio_create` shall create a frame codec to be used for encoding/decoding frames by calling `frame_codec_create` and passing `on_frame_codec_error` and a context as arguments.] */
            result->frame_codec = frame_codec_create(on_frame_codec_error, result);
            if (result->frame_codec == NULL)
            {
                /* Codes_SRS_SASLCLIENTIO_01_090: [If `frame_codec_create` fails, then `saslclientio_create` shall fail and return NULL.] */
                LogError("frame_codec_create failed");
                free(result);
                result = NULL;
            }
            else
            {
                /* Codes_SRS_SASLCLIENTIO_01_084: [`saslclientio_create` shall create a SASL frame codec to be used for SASL frame encoding/decoding by calling `sasl_frame_codec_create` and passing the just created frame codec as argument.] */
                result->sasl_frame_codec = sasl_frame_codec_create(result->frame_codec, on_sasl_frame_received_callback, on_sasl_frame_codec_error, result);
                if (result->sasl_frame_codec == NULL)
                {
                    /* Codes_SRS_SASLCLIENTIO_01_085: [If `sasl_frame_codec_create` fails, then `saslclientio_create` shall fail and return NULL.] */
                    LogError("sasl_frame_codec_create failed");
                    frame_codec_destroy(result->frame_codec);
                    free(result);
                    result = NULL;
                }
                else
                {
                    /* Codes_SRS_SASLCLIENTIO_01_004: [`saslclientio_create` shall return on success a non-NULL handle to a new SASL client IO instance.] */
                    result->on_bytes_received = NULL;
                    result->on_io_open_complete = NULL;
                    result->on_io_error = NULL;
                    result->on_io_close_complete = NULL;
                    result->on_bytes_received_context = NULL;
                    result->on_io_open_complete_context = NULL;
                    result->on_io_close_complete_context = NULL;
                    result->on_io_error_context = NULL;
                    result->sasl_mechanism = sasl_client_io_config->sasl_mechanism;

                    result->io_state = IO_STATE_NOT_OPEN;
                }
            }
        }
    }

    return result;
}